

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Json *pJVar4;
  Value *pVVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 uVar6;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  bool value_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar7;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  ArrayIndex index;
  pointer key;
  double value_01;
  Members members;
  string sStack_68;
  Members local_48;
  
  switch(value->field_0x8) {
  case 0:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    goto LAB_00112f9d;
  case 1:
    pJVar4 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&sStack_68,pJVar4,CONCAT71(extraout_var_04,extraout_DL_04));
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 2:
    pJVar4 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&sStack_68,pJVar4,CONCAT71(extraout_var_00,extraout_DL_00));
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 3:
    value_01 = Value::asDouble(value);
    valueToString_abi_cxx11_(&sStack_68,(Json *)value,value_01);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 4:
    pJVar4 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&sStack_68,pJVar4,(char *)CONCAT71(extraout_var,extraout_DL));
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 5:
    bVar2 = Value::asBool(value);
    valueToString_abi_cxx11_(&sStack_68,(Json *)(ulong)bVar2,value_00);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 6:
    std::__cxx11::string::append((char *)&this->document_);
    AVar3 = Value::size(value);
    index = 0;
    if ((int)AVar3 < 1) {
      AVar3 = 0;
    }
    for (; AVar3 != index; index = index + 1) {
      if (index != 0) {
        std::__cxx11::string::append((char *)&this->document_);
      }
      pVVar5 = Value::operator[](value,index);
      writeValue(this,pVVar5);
    }
LAB_00112f9d:
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    uVar6 = extraout_DL_01;
    uVar7 = extraout_var_01;
    for (key = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        key != local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; key = key + 1) {
      if (key != local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)psVar1);
        uVar6 = extraout_DL_02;
        uVar7 = extraout_var_02;
      }
      valueToQuotedString_abi_cxx11_
                (&sStack_68,(Json *)(key->_M_dataplus)._M_p,(char *)CONCAT71(uVar7,uVar6));
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&sStack_68);
      std::__cxx11::string::append((char *)psVar1);
      pVVar5 = Value::operator[](value,key);
      writeValue(this,pVVar5);
      uVar6 = extraout_DL_03;
      uVar7 = extraout_var_03;
    }
    std::__cxx11::string::append((char *)psVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_00112d94_default;
  }
  std::__cxx11::string::~string((string *)&sStack_68);
switchD_00112d94_default:
  return;
}

Assistant:

ValueType Value::type() const { return type_; }